

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall
AI::HierarchicalTaskNetworkComponent::HierarchicalTaskNetworkComponent
          (HierarchicalTaskNetworkComponent *this,Actor *owner)

{
  _Rb_tree_header *p_Var1;
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  *this_00;
  uint uVar2;
  long lVar3;
  mapped_type *pmVar4;
  _func_int **pp_Var5;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  Component::Component(&this->super_Component,owner);
  (this->super_Component)._vptr_Component = (_func_int **)&PTR_initializeComponent_0013dcd0;
  (this->super_IFixedTickable)._vptr_IFixedTickable = (_func_int **)&DAT_0013dcf0;
  this->frameCount = 0;
  p_Var1 = &(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header;
  (this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header + 8
   ) = (_Base_ptr)0x0;
  (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->planner).plan.tasks.super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->planner).plan.currentTask._M_current = (Task *)0x0;
  (this->planner).plan.planPath.
  super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->planner).plan.planPath.
  super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->planner).plan.planPath.
  super__Vector_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->planner).plan.currentPathVertex._M_current = (TaskIdentifier *)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)
   ((long)&(this->planner).plan.implementationsUsed._M_t._M_impl.super__Rb_tree_header._M_node_count
   + 7) = 0;
  (this->planner).parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->planner).parameters.flags.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_finish + 8) = 0;
  (this->planner).parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->planner).parameters.vectors.
  super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->planner).parameters.vectors.
  super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->planner).parameters.vectors.
  super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->planner).parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->planner).parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->planner).parameters.values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->planner).parameters.values.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->planner).parameters.flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start + 4) = 0;
  p_Var1 = &(this->state).current.flags._M_t._M_impl.super__Rb_tree_header;
  (this->state).current.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->state).current.flags._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->state).current.flags._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1
  ;
  *(_Rb_tree_header **)
   ((long)&(this->state).current.flags._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1
  ;
  (this->state).current.flags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->state).current.values._M_t._M_impl.super__Rb_tree_header;
  (this->state).current.values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->state).current.values._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->state).current.values._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->state).current.values._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var1;
  (this->state).current.values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->state).current.vectors._M_t._M_impl.super__Rb_tree_header;
  (this->state).current.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->state).current.vectors._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->state).current.vectors._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->state).current.vectors._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var1;
  (this->state).current.vectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->state).facts.flags._M_t._M_impl.super__Rb_tree_header;
  (this->state).facts.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)((long)&(this->state).facts.flags._M_t._M_impl.super__Rb_tree_header._M_header + 8)
       = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->state).facts.flags._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->state).facts.flags._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->state).facts.flags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->state).facts.values._M_t._M_impl.super__Rb_tree_header;
  (this->state).facts.values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)((long)&(this->state).facts.values._M_t._M_impl.super__Rb_tree_header._M_header + 8)
       = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->state).facts.values._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->state).facts.values._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->state).facts.values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->state).facts.vectors._M_t._M_impl.super__Rb_tree_header;
  (this->state).facts.vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->state).facts.vectors._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->state).facts.vectors._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1
  ;
  *(_Rb_tree_header **)
   ((long)&(this->state).facts.vectors._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1
  ;
  (this->state).memory.shortTermMemory.super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state).memory.shortTermMemory.super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state).memory.shortTermMemory.super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).memory.sensoryMemory.super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).memory.sensoryMemory.super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state).facts.vectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->state).memory.sensoryMemory.super__Vector_base<AI::Stimulus,_std::allocator<AI::Stimulus>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state).memory.focus = -1;
  *(undefined8 *)
   ((long)&(this->state).memory.focusLocus.
           super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->state).memory.focusLocus.
           super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->state).memory.focusLocus.
  super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state).memory.focusLocus.
  super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).barker.speech._M_dataplus._M_p = (pointer)&(this->state).barker.speech.field_2;
  (this->state).barker.speech._M_string_length = 0;
  (this->state).barker.speech.field_2._M_local_buf[0] = '\0';
  (this->state).changes.super__Vector_base<AI::StateChanges,_std::allocator<AI::StateChanges>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state).changes.super__Vector_base<AI::StateChanges,_std::allocator<AI::StateChanges>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).changes.super__Vector_base<AI::StateChanges,_std::allocator<AI::StateChanges>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->state).valueTrackers._M_t._M_impl.super__Rb_tree_header;
  (this->state).valueTrackers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->state).valueTrackers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->state).valueTrackers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->state).valueTrackers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->state).valueTrackers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->state).actorsToIgnore.super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state).actorsToIgnore.super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).actorsToIgnore.super__Vector_base<AI::Actor_*,_std::allocator<AI::Actor_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state).actorsToIgnoreChanged = false;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->taskHistory).super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::_M_initialize_map
            (&(this->taskHistory).
              super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>,0);
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar2 = std::random_device::_M_getval();
  pp_Var5 = (_func_int **)(ulong)uVar2;
  (this->eng)._M_x[0] = (unsigned_long)pp_Var5;
  lVar3 = 0x6c;
  do {
    pp_Var5 = (_func_int **)
              (ulong)((((uint)((ulong)pp_Var5 >> 0x1e) ^ (uint)pp_Var5) * 0x6c078965 + (int)lVar3) -
                     0x6b);
    (&(this->super_Component)._vptr_Component)[lVar3] = pp_Var5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x2db);
  (this->eng)._M_p = 0x270;
  std::random_device::_M_fini();
  (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->utilityIterator)._M_current = (Utility *)0x0;
  (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentGoalName)._M_dataplus._M_p = (pointer)&(this->currentGoalName).field_2;
  (this->currentGoalName)._M_string_length = 0;
  (this->currentGoalName).field_2._M_local_buf[0] = '\0';
  (this->currentTaskName)._M_dataplus._M_p = (pointer)&(this->currentTaskName).field_2;
  (this->currentTaskName)._M_string_length = 0;
  (this->currentTaskName).field_2._M_local_buf[0] = '\0';
  (this->planPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->planPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->planPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->barker).timeRemaining = 0.0;
  (this->barker).barking = false;
  (this->barker).speech._M_dataplus._M_p = (pointer)&(this->barker).speech.field_2;
  (this->barker).speech._M_string_length = 0;
  (this->barker).speech.field_2._M_local_buf[0] = '\0';
  (this->utilityScores).super__Vector_base<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utilityScores).super__Vector_base<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->utilityScores).super__Vector_base<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->detailSightRadius = 800.0;
  this->motionSightRadius = 1600.0;
  this->detailAngle = 20.0;
  this->motionAngle = 40.0;
  this_00 = &(this->state).current.vectors;
  local_13b8._M_mt._M_x[0]._0_4_ = 5;
  pmVar4 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](this_00,(key_type *)&local_13b8);
  pmVar4->x = 0.0;
  pmVar4->y = 0.0;
  pmVar4->z = 0.0;
  local_13b8._M_mt._M_x[0]._0_4_ = 7;
  pmVar4 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](this_00,(key_type *)&local_13b8);
  pmVar4->x = 1000.0;
  pmVar4->y = 1000.0;
  pmVar4->z = 1000.0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->planPath,5);
  return;
}

Assistant:

HierarchicalTaskNetworkComponent::HierarchicalTaskNetworkComponent(Actor* owner)
	: Component(owner)
{
	detailSightRadius = 800.f;
	motionSightRadius = 1600.f;

	detailAngle = 20.f;
	motionAngle = detailAngle * 2.f;

	state.current.vectors[WorldStateIdentifier::CurrentPosition] = {};
	state.current.vectors[WorldStateIdentifier::PlayerPosition] = {1000, 1000, 1000};

	planPath.resize(5);
}